

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* phosg::split_context
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *s,char delim,size_t max_splits)

{
  byte bVar1;
  bool bVar2;
  runtime_error *this;
  bool bVar3;
  undefined7 in_register_00000011;
  ulong uVar4;
  size_type __pos;
  vector<char,_std::allocator<char>_> paren_stack;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  vector<char,_std::allocator<char>_> local_58;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_40;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000011,delim);
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  uVar4 = 0;
  __pos = 0;
  local_40 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__;
  if (s->_M_string_length != 0) {
    __pos = 0;
    uVar4 = 0;
    bVar2 = false;
    do {
      if (((bVar2) ||
          (local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start ==
           local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_finish)) ||
         ((s->_M_dataplus)._M_p[uVar4] !=
          local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish[-1])) {
        if (local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_start ==
            local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_finish) {
          bVar3 = false;
        }
        else {
          bVar3 = local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1] == '\"' ||
                  local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1] == '\'';
        }
        if (bVar2) {
          bVar2 = false;
        }
        else if ((bVar3) && ((s->_M_dataplus)._M_p[uVar4] == '\\')) {
          bVar2 = true;
        }
        if (!bVar3) {
          bVar1 = (s->_M_dataplus)._M_p[uVar4];
          if (bVar1 < 0x3c) {
            if (bVar1 == 0x22) {
              local_78._M_dataplus._M_p._0_1_ = 0x22;
              ::std::vector<char,_std::allocator<char>_>::emplace_back<char>
                        (&local_58,(char *)&local_78);
            }
            else if (bVar1 == 0x27) {
              local_78._M_dataplus._M_p._0_1_ = 0x27;
              ::std::vector<char,_std::allocator<char>_>::emplace_back<char>
                        (&local_58,(char *)&local_78);
            }
            else if (bVar1 == 0x28) {
              local_78._M_dataplus._M_p._0_1_ = 0x29;
              ::std::vector<char,_std::allocator<char>_>::emplace_back<char>
                        (&local_58,(char *)&local_78);
            }
            else {
LAB_0010e8ad:
              if ((bVar1 == (byte)local_34 &&
                   local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start ==
                   local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish) &&
                 ((max_splits == 0 ||
                  ((ulong)((long)*(pointer *)(local_40 + 8) - *(long *)local_40 >> 5) < max_splits))
                 )) {
                ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                substr(&local_78,s,__pos,uVar4 - __pos);
                ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>(local_40,&local_78);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_78._M_dataplus._M_p._1_7_,local_78._M_dataplus._M_p._0_1_) !=
                    &local_78.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT71(local_78._M_dataplus._M_p._1_7_,
                                           local_78._M_dataplus._M_p._0_1_),
                                  local_78.field_2._M_allocated_capacity + 1);
                }
                __pos = uVar4 + 1;
              }
            }
          }
          else if (bVar1 == 0x3c) {
            local_78._M_dataplus._M_p._0_1_ = 0x3e;
            ::std::vector<char,_std::allocator<char>_>::emplace_back<char>
                      (&local_58,(char *)&local_78);
          }
          else if (bVar1 == 0x5b) {
            local_78._M_dataplus._M_p._0_1_ = 0x5d;
            ::std::vector<char,_std::allocator<char>_>::emplace_back<char>
                      (&local_58,(char *)&local_78);
          }
          else {
            if (bVar1 != 0x7b) goto LAB_0010e8ad;
            local_78._M_dataplus._M_p._0_1_ = 0x7d;
            ::std::vector<char,_std::allocator<char>_>::emplace_back<char>
                      (&local_58,(char *)&local_78);
          }
        }
      }
      else {
        local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish + -1;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < s->_M_string_length);
  }
  if (__pos <= uVar4) {
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_78,s,__pos,0xffffffffffffffff);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(local_40,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_78._M_dataplus._M_p._1_7_,local_78._M_dataplus._M_p._0_1_) !=
        &local_78.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_78._M_dataplus._M_p._1_7_,local_78._M_dataplus._M_p._0_1_),
                      local_78.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    if (local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_40;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error(this,"unbalanced parentheses in split_context");
  __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

vector<string> split_context(const string& s, char delim, size_t max_splits) {
  vector<string> ret;
  vector<char> paren_stack;
  bool char_is_escaped = false;

  size_t z, last_start = 0;
  for (z = 0; z < s.size(); z++) {
    if (!char_is_escaped && !paren_stack.empty() && (s[z] == paren_stack.back())) {
      paren_stack.pop_back();
      continue;
    }
    bool in_quoted_string = (!paren_stack.empty() && ((paren_stack.back() == '\'') || (paren_stack.back() == '\"')));
    if (char_is_escaped) {
      char_is_escaped = false;
    } else if (in_quoted_string && s[z] == '\\') {
      char_is_escaped = true;
    }
    if (!in_quoted_string) {
      if (s[z] == '(') {
        paren_stack.push_back(')');
      } else if (s[z] == '[') {
        paren_stack.push_back(']');
      } else if (s[z] == '{') {
        paren_stack.push_back('}');
      } else if (s[z] == '<') {
        paren_stack.push_back('>');
      } else if (s[z] == '\'') {
        paren_stack.push_back('\'');
      } else if (s[z] == '\"') {
        paren_stack.push_back('\"');
      } else if (paren_stack.empty() && (s[z] == delim) && (!max_splits || (ret.size() < max_splits))) {
        ret.push_back(s.substr(last_start, z - last_start));
        last_start = z + 1;
      }
    }
  }

  if (z >= last_start) {
    ret.push_back(s.substr(last_start));
  }

  if (paren_stack.size()) {
    throw runtime_error("unbalanced parentheses in split_context");
  }

  return ret;
}